

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O1

Vector3D * __thiscall CMU462::Vertex::normal(Vector3D *__return_storage_ptr__,Vertex *this)

{
  double dVar1;
  double dVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  HalfedgeIter h;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  dVar8 = (this->position).x;
  dVar1 = (this->position).y;
  dVar2 = (this->position).z;
  p_Var6 = (this->_halfedge)._M_node;
  p_Var5 = p_Var6;
  do {
    bVar4 = Halfedge::isBoundary((Halfedge *)(p_Var5 + 1));
    if (bVar4) goto LAB_0016fcd5;
    p_Var5 = p_Var5[1]._M_prev[2]._M_next;
  } while ((this->_halfedge)._M_node != p_Var5);
  if (bVar4) {
LAB_0016fcd5:
    dVar16 = __return_storage_ptr__->x;
    dVar15 = __return_storage_ptr__->y;
    dVar14 = __return_storage_ptr__->z;
    do {
      p_Var5 = p_Var6[2]._M_next;
      p_Var3 = p_Var5[2]._M_prev;
      p_Var6 = p_Var5[1]._M_prev;
      p_Var5 = p_Var5[2]._M_next[2]._M_prev;
      dVar7 = (double)p_Var3[1]._M_prev - dVar8;
      dVar12 = (double)p_Var3[2]._M_next - dVar1;
      dVar10 = (double)p_Var3[2]._M_prev - dVar2;
      dVar11 = (double)p_Var5[1]._M_prev - dVar8;
      dVar9 = (double)p_Var5[2]._M_next - dVar1;
      dVar13 = (double)p_Var5[2]._M_prev - dVar2;
      dVar16 = dVar16 + (dVar12 * dVar13 - dVar9 * dVar10);
      dVar15 = dVar15 + (dVar10 * dVar11 - dVar13 * dVar7);
      dVar14 = dVar14 + (dVar9 * dVar7 - dVar11 * dVar12);
    } while (p_Var6 != (this->_halfedge)._M_node);
  }
  else {
    dVar16 = __return_storage_ptr__->x;
    dVar15 = __return_storage_ptr__->y;
    dVar14 = __return_storage_ptr__->z;
    do {
      p_Var5 = p_Var6[2]._M_next[2]._M_prev;
      p_Var3 = p_Var6[2]._M_next[2]._M_next[2]._M_prev;
      dVar7 = (double)p_Var5[1]._M_prev - dVar8;
      dVar12 = (double)p_Var5[2]._M_next - dVar1;
      dVar11 = (double)p_Var5[2]._M_prev - dVar2;
      dVar10 = (double)p_Var3[1]._M_prev - dVar8;
      dVar9 = (double)p_Var3[2]._M_next - dVar1;
      dVar13 = (double)p_Var3[2]._M_prev - dVar2;
      dVar16 = dVar16 + (dVar12 * dVar13 - dVar9 * dVar11);
      dVar15 = dVar15 + (dVar11 * dVar10 - dVar13 * dVar7);
      dVar14 = dVar14 + (dVar9 * dVar7 - dVar10 * dVar12);
      p_Var6 = p_Var6[1]._M_prev[2]._M_next;
    } while (p_Var6 != (this->_halfedge)._M_node);
  }
  __return_storage_ptr__->x = dVar16;
  __return_storage_ptr__->y = dVar15;
  __return_storage_ptr__->z = dVar14;
  dVar8 = dVar14 * dVar14 + dVar16 * dVar16 + dVar15 * dVar15;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar8 = 1.0 / dVar8;
  __return_storage_ptr__->x = dVar16 * dVar8;
  __return_storage_ptr__->y = dVar15 * dVar8;
  __return_storage_ptr__->z = dVar14 * dVar8;
  return __return_storage_ptr__;
}

Assistant:

Vector3D normal() const {
          Vector3D N( 0., 0., 0. );
          Vector3D pi = position;

          // Iterate over neighbors.
          HalfedgeCIter h = halfedge();
          if (isBoundary()) {
            do {
              Vector3D pj = h->next()->vertex()->position;
              Vector3D pk = h->next()->next()->vertex()->position;
              N += cross( pj-pi, pk-pi );
              h = h->next()->twin();
            } while( h != halfedge() );      
          } else {
            do {
              Vector3D pj = h->next()->vertex()->position;
              Vector3D pk = h->next()->next()->vertex()->position;
              N += cross( pj-pi, pk-pi );
              h = h->twin()->next();
            } while( h != halfedge() );
          }

          N.normalize();

          return N;
        }